

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O3

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::AddRawTransaction
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          string *tx_hex,
          vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *txins,
          vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
          *pegins,vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  *txouts,
          vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
          *pegouts,ConfidentialTxOut *txout_fee,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *pegout_addresses)

{
  pointer pCVar1;
  pointer pTVar2;
  pointer pCVar3;
  pointer pTVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  _Alloc_hider _Var9;
  pointer this_00;
  ByteData *tx_out_proof;
  pointer pTVar10;
  pointer this_01;
  pointer value;
  Amount AVar11;
  undefined1 local_a68 [16];
  _func_int *local_a58 [3];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *local_a40;
  Script *local_a38;
  AddressFormatData *local_a30;
  string *local_a28;
  ulong local_a20;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *local_a18;
  Script *local_a10;
  AddressFormatData *local_a08;
  undefined1 local_a00 [24];
  ConfidentialNonce local_9e8;
  Address pegout_address;
  Address dummy_addr;
  ConfidentialTxOutReference local_6d0;
  ConfidentialTxOutReference local_5d8;
  ConfidentialTxInReference local_4e0;
  ConfidentialTxOutReference local_380;
  ConfidentialTxOutReference local_288;
  ConfidentialTxInReference local_190;
  
  ConfidentialTransactionController::ConfidentialTransactionController
            (__return_storage_ptr__,tx_hex);
  uVar6 = AbstractTransactionController::GetLockTimeDisabledSequence();
  this_00 = (txins->
            super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (txins->
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pCVar1) {
    do {
      uVar7 = core::AbstractTxIn::GetSequence(&this_00->super_AbstractTxIn);
      if (uVar6 == uVar7) {
        core::AbstractTxIn::GetTxid((Txid *)&pegout_address,&this_00->super_AbstractTxIn);
        uVar7 = core::AbstractTxIn::GetVout(&this_00->super_AbstractTxIn);
        uVar8 = AbstractTransactionController::GetDefaultSequence
                          (&__return_storage_ptr__->super_AbstractTransactionController);
        ConfidentialTransactionController::AddTxIn
                  (&local_4e0,__return_storage_ptr__,(Txid *)&pegout_address,uVar7,uVar8);
        core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_4e0);
      }
      else {
        core::AbstractTxIn::GetTxid((Txid *)&pegout_address,&this_00->super_AbstractTxIn);
        uVar7 = core::AbstractTxIn::GetVout(&this_00->super_AbstractTxIn);
        uVar8 = core::AbstractTxIn::GetSequence(&this_00->super_AbstractTxIn);
        ConfidentialTransactionController::AddTxIn
                  (&local_190,__return_storage_ptr__,(Txid *)&pegout_address,uVar7,uVar8);
        core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_190);
      }
      pegout_address._0_8_ = &PTR__Txid_00723450;
      if ((void *)pegout_address._8_8_ != (void *)0x0) {
        pegout_address._0_8_ = &PTR__Txid_00723450;
        operator_delete((void *)pegout_address._8_8_);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pCVar1);
  }
  pTVar10 = (pegins->
            super__Vector_base<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (pegins->
           super__Vector_base<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar10 != pTVar2) {
    tx_out_proof = &pTVar10->mainchain_txoutproof;
    do {
      ConfidentialTransactionController::AddPeginWitness
                (__return_storage_ptr__,(Txid *)((long)(tx_out_proof + -9) + 8),
                 *(uint32_t *)((long)(tx_out_proof + -8) + 0x10),(Amount *)(tx_out_proof + -7),
                 (ConfidentialAssetId *)((Amount *)(tx_out_proof + -7) + 1),
                 (BlockHash *)((long)(tx_out_proof + -5) + 8),
                 (Script *)((long)(tx_out_proof + -4) + 0x10),tx_out_proof + -1,tx_out_proof);
      pTVar10 = (pointer)(tx_out_proof + 1);
      tx_out_proof = (ByteData *)((long)(tx_out_proof + 9) + 0x10);
    } while (pTVar10 != pTVar2);
  }
  this_01 = (txouts->
            super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (txouts->
           super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != pCVar3) {
    do {
      core::AbstractTxOut::GetLockingScript((Script *)&pegout_address,&this_01->super_AbstractTxOut)
      ;
      core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&dummy_addr,&this_01->confidential_value_);
      AVar11 = core::ConfidentialValue::GetAmount((ConfidentialValue *)&dummy_addr);
      local_a00._0_8_ = AVar11.amount_;
      local_a00[8] = AVar11.ignore_check_;
      core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_a68,&this_01->asset_);
      core::ConfidentialNonce::ConfidentialNonce(&local_9e8,&this_01->nonce_);
      ConfidentialTransactionController::AddTxOut
                (&local_288,__return_storage_ptr__,(Script *)&pegout_address,(Amount *)local_a00,
                 (ConfidentialAssetId *)local_a68,&local_9e8);
      core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_288);
      local_9e8._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_00723710;
      if (local_9e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_9e8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_a68._0_8_ = &PTR__ConfidentialAssetId_00723760;
      if ((void *)CONCAT71(local_a68._9_7_,local_a68[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_a68._9_7_,local_a68[8]));
      }
      dummy_addr._0_8_ = &PTR__ConfidentialValue_00723840;
      if ((void *)CONCAT71(dummy_addr._9_7_,(undefined1)dummy_addr.witness_ver_) != (void *)0x0) {
        operator_delete((void *)CONCAT71(dummy_addr._9_7_,(undefined1)dummy_addr.witness_ver_));
      }
      core::Script::~Script((Script *)&pegout_address);
      this_01 = this_01 + 1;
    } while (this_01 != pCVar3);
  }
  value = (pegouts->
          super__Vector_base<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pTVar4 = (pegouts->
           super__Vector_base<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (value != pTVar4) {
    local_a30 = &dummy_addr.format_data_;
    local_a38 = &dummy_addr.redeem_script_;
    local_a40 = &dummy_addr.script_tree_.nodes_;
    local_a08 = &pegout_address.format_data_;
    local_a10 = &pegout_address.redeem_script_;
    local_a18 = &pegout_address.script_tree_.nodes_;
    do {
      core::Address::Address(&pegout_address);
      bVar5 = core::Pubkey::IsValid(&value->online_pubkey);
      if (bVar5) {
        bVar5 = core::Privkey::IsInvalid((Privkey *)&value->master_online_key);
        if (bVar5) goto LAB_003c532d;
        core::Address::Address(&dummy_addr);
        local_a28 = &value->bitcoin_descriptor;
        local_a20 = (ulong)(uint)value->net_type;
        ConfidentialTransactionController::AddPegoutTxOut
                  (&local_5d8,__return_storage_ptr__,&value->amount,&value->asset,
                   &value->genesisblock_hash,&dummy_addr,value->net_type,&value->online_pubkey,
                   (Privkey *)&value->master_online_key,local_a28,value->bip32_counter,
                   &value->whitelist,value->elements_net_type,&pegout_address);
        core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_5d8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_a30);
        core::Script::~Script(local_a38);
        dummy_addr.script_tree_.super_TapBranch._vptr_TapBranch =
             (_func_int **)&PTR__TaprootScriptTree_0072eb30;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (local_a40);
        core::TapBranch::~TapBranch(&dummy_addr.script_tree_.super_TapBranch);
        if (dummy_addr.schnorr_pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(dummy_addr.schnorr_pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (dummy_addr.pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(dummy_addr.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (dummy_addr.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(dummy_addr.hash_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        _Var9._M_p = dummy_addr.address_._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dummy_addr.address_._M_dataplus._M_p != &dummy_addr.address_.field_2)
        goto LAB_003c5510;
      }
      else {
LAB_003c532d:
        core::Pubkey::Pubkey((Pubkey *)&local_9e8);
        core::Privkey::Privkey((Privkey *)&dummy_addr);
        local_a68._0_8_ = local_a58;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a68,"");
        core::ByteData::ByteData((ByteData *)local_a00);
        ConfidentialTransactionController::AddPegoutTxOut
                  (&local_380,__return_storage_ptr__,&value->amount,&value->asset,
                   &value->genesisblock_hash,&value->btc_address,kMainnet,(Pubkey *)&local_9e8,
                   (Privkey *)&dummy_addr,(string *)local_a68,0,(ByteData *)local_a00,kLiquidV1,
                   (Address *)0x0);
        core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_380);
        if ((pointer)local_a00._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_a00._0_8_);
        }
        if ((_func_int **)local_a68._0_8_ != local_a58) {
          operator_delete((void *)local_a68._0_8_);
        }
        if (dummy_addr._0_8_ != 0) {
          operator_delete((void *)dummy_addr._0_8_);
        }
        _Var9._M_p = (pointer)local_9e8._vptr_ConfidentialNonce;
        if (local_9e8._vptr_ConfidentialNonce != (_func_int **)0x0) {
LAB_003c5510:
          operator_delete(_Var9._M_p);
        }
      }
      if (pegout_addresses !=
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
           *)0x0) {
        core::Address::GetAddress_abi_cxx11_((string *)&dummy_addr,&pegout_address);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
        ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
                    *)pegout_addresses,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy_addr,
                   &value->amount);
        if ((string *)dummy_addr._0_8_ != &dummy_addr.address_) {
          operator_delete((void *)dummy_addr._0_8_);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_a08);
      core::Script::~Script(local_a10);
      pegout_address.script_tree_.super_TapBranch._vptr_TapBranch =
           (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (local_a18);
      core::TapBranch::~TapBranch(&pegout_address.script_tree_.super_TapBranch);
      if (pegout_address.schnorr_pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(pegout_address.schnorr_pubkey_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (pegout_address.pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(pegout_address.pubkey_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (pegout_address.hash_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(pegout_address.hash_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pegout_address.address_._M_dataplus._M_p != &pegout_address.address_.field_2) {
        operator_delete(pegout_address.address_._M_dataplus._M_p);
      }
      value = value + 1;
    } while (value != pTVar4);
  }
  core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&pegout_address,&txout_fee->confidential_value_);
  AVar11 = core::ConfidentialValue::GetAmount((ConfidentialValue *)&pegout_address);
  dummy_addr._0_8_ = AVar11.amount_;
  dummy_addr.witness_ver_._0_1_ = AVar11.ignore_check_;
  bVar5 = core::Amount::operator!=((Amount *)&dummy_addr,0);
  pegout_address._0_8_ = &PTR__ConfidentialValue_00723840;
  if (pegout_address._8_8_ != 0) {
    operator_delete((void *)pegout_address._8_8_);
  }
  if (bVar5) {
    core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&pegout_address,&txout_fee->confidential_value_);
    AVar11 = core::ConfidentialValue::GetAmount((ConfidentialValue *)&pegout_address);
    local_a68._0_8_ = AVar11.amount_;
    local_a68[8] = AVar11.ignore_check_;
    core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)&dummy_addr,&txout_fee->asset_);
    ConfidentialTransactionController::AddTxOutFee
              (&local_6d0,__return_storage_ptr__,(Amount *)local_a68,
               (ConfidentialAssetId *)&dummy_addr);
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_6d0);
    dummy_addr._0_8_ = &PTR__ConfidentialAssetId_00723760;
    if ((void *)CONCAT71(dummy_addr._9_7_,(undefined1)dummy_addr.witness_ver_) != (void *)0x0) {
      operator_delete((void *)CONCAT71(dummy_addr._9_7_,(undefined1)dummy_addr.witness_ver_));
    }
    pegout_address._0_8_ = &PTR__ConfidentialValue_00723840;
    if (pegout_address._8_8_ != 0) {
      operator_delete((void *)pegout_address._8_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::AddRawTransaction(
    const std::string& tx_hex, const std::vector<ConfidentialTxIn>& txins,
    const std::vector<TxInPeginParameters>& pegins,
    const std::vector<ConfidentialTxOut>& txouts,
    const std::vector<TxOutPegoutParameters>& pegouts,
    const ConfidentialTxOut& txout_fee,
    std::map<std::string, Amount>* pegout_addresses) const {
  ConfidentialTransactionController ctxc(tx_hex);

  // TxInの追加
  const uint32_t kLockTimeDisabledSequence =
      ctxc.GetLockTimeDisabledSequence();
  for (const auto& txin : txins) {
    // TxInのunlocking_scriptは空で作成
    if (kLockTimeDisabledSequence == txin.GetSequence()) {
      ctxc.AddTxIn(txin.GetTxid(), txin.GetVout(), ctxc.GetDefaultSequence());
    } else {
      ctxc.AddTxIn(txin.GetTxid(), txin.GetVout(), txin.GetSequence());
    }
  }

  for (const auto& pegin_data : pegins) {
    ctxc.AddPeginWitness(
        pegin_data.txid, pegin_data.vout, pegin_data.amount, pegin_data.asset,
        pegin_data.mainchain_blockhash, pegin_data.claim_script,
        pegin_data.mainchain_raw_tx, pegin_data.mainchain_txoutproof);
  }

  // TxOutの追加
  for (const auto& txout : txouts) {
    ctxc.AddTxOut(
        txout.GetLockingScript(), txout.GetConfidentialValue().GetAmount(),
        txout.GetAsset(), txout.GetNonce());
  }

  for (const auto& pegout_data : pegouts) {
    Address pegout_address;
    if (pegout_data.online_pubkey.IsValid() &&
        !pegout_data.master_online_key.IsInvalid()) {
      Address dummy_addr;
      ctxc.AddPegoutTxOut(
          pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
          dummy_addr, pegout_data.net_type, pegout_data.online_pubkey,
          pegout_data.master_online_key, pegout_data.bitcoin_descriptor,
          pegout_data.bip32_counter, pegout_data.whitelist,
          pegout_data.elements_net_type, &pegout_address);
    } else {
      ctxc.AddPegoutTxOut(
          pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
          pegout_data.btc_address);
    }
    if (pegout_addresses != nullptr) {
      pegout_addresses->emplace(
          pegout_address.GetAddress(), pegout_data.amount);
    }
  }

  // amountが0のfeeは無効と判定
  if (txout_fee.GetConfidentialValue().GetAmount() != 0) {
    ctxc.AddTxOutFee(
        txout_fee.GetConfidentialValue().GetAmount(), txout_fee.GetAsset());
  }

  return ctxc;
}